

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v9::detail::bigint::assign_pow10(bigint *this,int exp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (exp != 0) {
    iVar1 = 1;
    do {
      iVar2 = iVar1;
      iVar1 = iVar2 * 2;
    } while (iVar2 <= exp);
    assign<unsigned_long,_0>(this,5);
    for (uVar3 = iVar2 >> 2; uVar3 != 0; uVar3 = (int)uVar3 >> 1) {
      square(this);
      if ((uVar3 & exp) != 0) {
        multiply(this,5);
      }
    }
    operator<<=(this,exp);
    return;
  }
  assign<unsigned_long,_0>(this,1);
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return *this = 1;
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    *this = 5;
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }